

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Projection::PayloadSize(Projection *this)

{
  uint8 *puVar1;
  uint64 uVar2;
  uint64 in_RDI;
  uint64_t size;
  float fVar3;
  uint64 in_stack_fffffffffffffff0;
  
  uVar2 = in_RDI;
  puVar1 = (uint8 *)EbmlElementSize(in_stack_fffffffffffffff0,in_RDI);
  if ((*(long *)(in_RDI + 0x18) != 0) && (*(long *)(in_RDI + 0x10) != 0)) {
    uVar2 = EbmlElementSize(uVar2,puVar1,in_RDI);
    puVar1 = puVar1 + uVar2;
  }
  fVar3 = (float)(in_RDI >> 0x20);
  uVar2 = EbmlElementSize((uint64)puVar1,fVar3);
  puVar1 = puVar1 + uVar2;
  uVar2 = EbmlElementSize((uint64)puVar1,fVar3);
  puVar1 = puVar1 + uVar2;
  uVar2 = EbmlElementSize((uint64)puVar1,fVar3);
  return (uint64_t)(puVar1 + uVar2);
}

Assistant:

uint64_t Projection::PayloadSize() const {
  uint64_t size =
      EbmlElementSize(libwebm::kMkvProjection, static_cast<uint64>(type_));

  if (private_data_length_ > 0 && private_data_ != NULL) {
    size += EbmlElementSize(libwebm::kMkvProjectionPrivate, private_data_,
                            private_data_length_);
  }

  size += EbmlElementSize(libwebm::kMkvProjectionPoseYaw, pose_yaw_);
  size += EbmlElementSize(libwebm::kMkvProjectionPosePitch, pose_pitch_);
  size += EbmlElementSize(libwebm::kMkvProjectionPoseRoll, pose_roll_);

  return size;
}